

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O1

void __thiscall
helics::CoreFactory::defineCoreBuilder
          (CoreFactory *this,shared_ptr<helics::CoreFactory::CoreBuilder> *builder,string_view name,
          int code)

{
  shared_ptr<helics::CoreFactory::MasterCoreBuilder> *psVar1;
  int local_2c;
  shared_ptr<helics::CoreFactory::CoreBuilder> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = (char *)name._M_len;
  local_28.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)this;
  local_28.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)this = 0;
  local_2c = (int)name._M_str;
  local_18._M_len = (size_t)builder;
  psVar1 = MasterCoreBuilder::instance();
  std::
  vector<std::tuple<int,std::__cxx11::string,std::shared_ptr<helics::CoreFactory::CoreBuilder>>,std::allocator<std::tuple<int,std::__cxx11::string,std::shared_ptr<helics::CoreFactory::CoreBuilder>>>>
  ::
  emplace_back<int&,std::basic_string_view<char,std::char_traits<char>>&,std::shared_ptr<helics::CoreFactory::CoreBuilder>>
            ((vector<std::tuple<int,std::__cxx11::string,std::shared_ptr<helics::CoreFactory::CoreBuilder>>,std::allocator<std::tuple<int,std::__cxx11::string,std::shared_ptr<helics::CoreFactory::CoreBuilder>>>>
              *)(psVar1->
                super___shared_ptr<helics::CoreFactory::MasterCoreBuilder,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr,&local_2c,&local_18,&local_28);
  if (local_28.super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_28.
               super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void defineCoreBuilder(std::shared_ptr<CoreBuilder> builder, std::string_view name, int code)
{
    MasterCoreBuilder::addBuilder(std::move(builder), name, code);
}